

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O3

_Bool borg_load_formulas(ang_file *fp)

{
  int iVar1;
  bool bVar2;
  _Bool _Var3;
  undefined1 uVar4;
  char *s;
  size_t sVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  char buf [1024];
  char acStack_438 [1032];
  
  uVar6 = 0;
  borg_formulas.restock.count = 0;
  borg_formulas.depth.count = 0;
  borg_formulas.power.count = 0;
  iVar1 = borg_cfg[0xd];
  _Var3 = file_getl(fp,acStack_438,0x3ff);
  if (_Var3) {
    bVar7 = iVar1 == 0;
    bVar8 = true;
    bVar2 = bVar7;
    do {
      s = borg_trim(acStack_438);
      if ((*s != '\0') && (*s != '#')) {
        _Var3 = prefix_i(s,"[END FORMULA SECTION]");
        if (_Var3) break;
        if (!bVar7) {
          if (*s == ']') {
            if (uVar6 == 0) {
              return false;
            }
            uVar6 = 0;
          }
          else if (*s == '[') {
            if (!bVar8) {
              bVar7 = true;
              bVar2 = true;
            }
            bVar8 = false;
          }
          else {
            _Var3 = prefix_i(s,"Power");
            if (_Var3) {
              bVar8 = uVar6 != 0;
              uVar6 = 1;
              if (bVar8) {
                bVar7 = true;
                bVar2 = true;
              }
              bVar8 = true;
            }
            else {
              _Var3 = prefix_i(s,"Depth Requirement");
              if (_Var3) {
                if (uVar6 != 0) {
                  bVar7 = true;
                }
                bVar8 = true;
                uVar6 = 2;
                bVar2 = bVar7;
              }
              else {
                _Var3 = prefix_i(s,"Restock Requirement");
                if (_Var3) {
                  if (uVar6 != 0) {
                    bVar7 = true;
                  }
                  bVar8 = true;
                  uVar6 = 3;
                  bVar2 = bVar7;
                }
                else {
                  sVar5 = strlen(s);
                  if (s[sVar5 - 1] == ';') {
                    uVar4 = (*(code *)((long)&DAT_00285718 + (long)(int)(&DAT_00285718)[uVar6]))();
                    return (_Bool)uVar4;
                  }
                  if (uVar6 == 1) {
                    borg_formula_error(acStack_438,acStack_438,"power","** line must end in a ;");
                    uVar6 = 1;
                  }
                  else if (uVar6 == 3) {
                    borg_formula_error(acStack_438,acStack_438,"restock","** line must end in a ;");
                    uVar6 = 3;
                  }
                  else if (uVar6 == 2) {
                    borg_formula_error(acStack_438,acStack_438,"depth","** line must end in a ;");
                    uVar6 = 2;
                  }
                  else {
                    borg_formula_error(acStack_438,acStack_438,"base","** line must end in a ;");
                  }
                  bVar7 = true;
                  bVar2 = true;
                }
              }
            }
          }
        }
      }
      _Var3 = file_getl(fp,acStack_438,0x3ff);
    } while (_Var3);
    if (!bVar2) {
      return false;
    }
  }
  else if (iVar1 != 0) {
    return false;
  }
  if (borg_cfg[0xd] != 0) {
    borg_cfg[0xd] = 0;
  }
  return true;
}

Assistant:

bool borg_load_formulas(ang_file *fp)
{
    enum e_section { SEC_NONE, SEC_POWER, SEC_DEPTH, SEC_RESTOCK };

    char           buf[1024];
    bool           formulas_off = false;
    enum e_section section      = SEC_NONE;
    bool           skip_open    = true;

    borg_formulas.restock.count = 0;
    borg_formulas.depth.count   = 0;
    borg_formulas.power.count   = 0;

    /* read but don't process formulas if we aren't using them */
    if (!borg_cfg[BORG_USES_DYNAMIC_CALCS])
        formulas_off = true;

    /* Parse the formula section of the file */
    while (file_getl(fp, buf, sizeof(buf) - 1)) {

        char *line = borg_trim(buf);

        /* Skip comments and blank lines */
        if (!line[0] || (line[0] == '#'))
            continue;

        if (prefix_i(line, "[END FORMULA SECTION]"))
            break;

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        /* sections are bounded in [] */
        if (line[0] == '[') {
            if (!skip_open)
                formulas_off = true;

            skip_open = false;
            continue;
        }
        if (line[0] == ']') {
            if (section == SEC_NONE)
                return formulas_off;
            section = SEC_NONE;
            continue;
        }

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        if (prefix_i(line, "Power")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_POWER;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Depth Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_DEPTH;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Restock Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_RESTOCK;
            skip_open = true;
            continue;
        }

        /* lines must end in ; */
        if (line[strlen(line) - 1] != ';') {
            if (section == SEC_DEPTH)
                borg_formula_error(
                    buf, buf, "depth", "** line must end in a ;");
            else if (section == SEC_POWER)
                borg_formula_error(
                    buf, buf, "power", "** line must end in a ;");
            else if (section == SEC_RESTOCK)
                borg_formula_error(
                    buf, buf, "restock", "** line must end in a ;");
            else
                borg_formula_error(buf, buf, "base", "** line must end in a ;");
            formulas_off = true;
        } else {
            if (section == SEC_DEPTH)
                formulas_off = parse_depth_line(false, line, buf);
            if (section == SEC_RESTOCK)
                formulas_off = parse_depth_line(true, line, buf);
            if (section == SEC_POWER)
                formulas_off = parse_power_line(line, buf);
            if (section == SEC_NONE) {
                borg_formula_error(buf, buf, "base",
                    "** line must be part of a Power or Depth section");
                formulas_off = true;
            }
        }
    }
    if (formulas_off && borg_cfg[BORG_USES_DYNAMIC_CALCS])
        borg_cfg[BORG_USES_DYNAMIC_CALCS] = false;

    return formulas_off;
}